

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

ON_wString __thiscall ON_Annotation::PlainText(ON_Annotation *this)

{
  ON_TextContent *this_00;
  int iVar1;
  ON_TextRunArray *this_01;
  ON_Geometry *in_RSI;
  ON_BoundingBox local_40;
  
  this_00 = (ON_TextContent *)in_RSI[0xb].super_ON_Object.m_userdata_list;
  if (this_00 == (ON_TextContent *)0x0) {
    ON_wString::ON_wString((ON_wString *)this,&ON_wString::EmptyString);
  }
  else {
    this_01 = ON_TextContent::TextRuns(this_00,true);
    if (this_01 != (ON_TextRunArray *)0x0) {
      iVar1 = ON_TextRunArray::Count(this_01);
      if (iVar1 == 0) {
        ON_Geometry::BoundingBox(&local_40,in_RSI);
      }
    }
    ON_TextContent::PlainText((ON_TextContent *)this);
  }
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_Annotation::PlainText() const
{
  if (nullptr == m_text)
    return ON_wString::EmptyString;
  const ON_TextRunArray* runs = m_text->TextRuns(true);
  if (nullptr != runs && 0 == runs->Count())
    BoundingBox();  // Side effect of building text runs
  return m_text->PlainText();
}